

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O3

void __thiscall icu_63::UnifiedCache::removeSoftRef(UnifiedCache *this,SharedObject *value)

{
  int32_t *piVar1;
  int32_t iVar2;
  
  piVar1 = &value->softRefCount;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    this->fNumValuesTotal = this->fNumValuesTotal + -1;
    iVar2 = SharedObject::getRefCount(value);
    if (iVar2 == 0) {
      (*(value->super_UObject)._vptr_UObject[1])(value);
      return;
    }
    value->cachePtr = (UnifiedCacheBase *)0x0;
  }
  return;
}

Assistant:

void UnifiedCache::removeSoftRef(const SharedObject *value) const {
    U_ASSERT(value->cachePtr == this);
    U_ASSERT(value->softRefCount > 0);
    if (--value->softRefCount == 0) {
        --fNumValuesTotal;
        if (value->noHardReferences()) {
            delete value;
        } else {
            // This path only happens from flush(all). Which only happens from the
            // UnifiedCache destructor.  Nulling out value.cacheptr changes the behavior
            // of value.removeRef(), causing the deletion to be done there.
            value->cachePtr = nullptr;
        }
    }
}